

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O3

_Bool zlib_decompress_block(ssh_decompressor *dc,uchar *block,int len,uchar **outblock,int *outlen)

{
  ssh_decompressor *nbitsp;
  ssh_decompressor *bitsp;
  ssh_decompressor *ztab;
  ssh_decompressor *ztab_00;
  uchar *lengths;
  ssh_decompressor *psVar1;
  byte *pbVar2;
  byte bVar3;
  uchar uVar4;
  short sVar5;
  int iVar6;
  bool bVar7;
  ushort uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  uint uVar13;
  ssh_compression_alg *psVar14;
  uchar *puVar15;
  ushort uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ssh_compression_alg *psVar20;
  
  if (dc[-1].vt != (ssh_compression_alg *)0x0) {
    __assert_fail("!dctx->outblk",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0x3e9,
                  "_Bool zlib_decompress_block(ssh_decompressor *, const unsigned char *, int, unsigned char **, int *)"
                 );
  }
  psVar14 = (ssh_compression_alg *)strbuf_new_nm();
  dc[-1].vt = psVar14;
  nbitsp = dc + -0x1002;
  bitsp = dc + -0x1003;
  ztab = dc + -0x1035;
  ztab_00 = dc + -0x1036;
  puVar15 = (uchar *)((long)&dc[-0x102c].vt + 7);
  lengths = (uchar *)((long)&dc[-0x102e].vt + 4);
switchD_0012a47d_default:
  iVar12 = *(int *)&nbitsp->vt;
  if (len < 1) {
    if (iVar12 < 1) goto LAB_0012ac39;
  }
  else if (iVar12 < 0x18 && 0 < len) {
    psVar14 = bitsp->vt;
    iVar17 = iVar12;
    uVar13 = len;
    do {
      bVar3 = *block;
      block = block + 1;
      psVar14 = (ssh_compression_alg *)
                ((ulong)((uint)bVar3 << ((byte)iVar17 & 0x1f)) | (ulong)psVar14);
      bitsp->vt = psVar14;
      iVar12 = iVar17 + 8;
      *(int *)&nbitsp->vt = iVar12;
      len = uVar13 - 1;
      if (0xf < iVar17) break;
      bVar7 = 1 < uVar13;
      iVar17 = iVar12;
      uVar13 = len;
    } while (bVar7);
  }
  switch(*(undefined4 *)&dc[-0x1033].vt) {
  case 0:
    if (iVar12 < 0x10) {
LAB_0012ac39:
      psVar14 = dc[-1].vt;
      *outlen = *(int *)&psVar14->compress_new;
      puVar15 = (uchar *)strbuf_to_str((strbuf *)psVar14);
      *outblock = puVar15;
      dc[-1].vt = (ssh_compression_alg *)0x0;
      return true;
    }
    uVar16 = (ushort)bitsp->vt;
    uVar8 = uVar16 << 8;
    uVar16 = uVar8 | uVar16 >> 8;
    *(int *)&nbitsp->vt = iVar12 + -0x10;
    bitsp->vt = (ssh_compression_alg *)((ulong)bitsp->vt >> 0x10);
    if (((0x842 < (ushort)(uVar16 * 0x7bdf)) || ((uVar16 & 0xf20) != 0x800)) ||
       (0x7000 < (uVar8 & 0xf000))) goto LAB_0012ac60;
    break;
  case 1:
    if (iVar12 < 3) goto LAB_0012ac39;
    psVar14 = bitsp->vt;
    uVar13 = iVar12 - 3;
    *(uint *)&nbitsp->vt = uVar13;
    psVar20 = (ssh_compression_alg *)((ulong)psVar14 >> 3);
    bitsp->vt = psVar20;
    switch((uint)((ulong)psVar14 >> 1) & 3) {
    case 0:
      *(undefined4 *)&dc[-0x1033].vt = 10;
      *(uint *)&dc[-0x1002].vt = uVar13 & 0xfffffff8;
      dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar20 >> ((byte)uVar13 & 7));
      break;
    case 1:
      uVar9 = *(undefined4 *)((long)&dc[-0x1038].vt + 4);
      uVar10 = *(undefined4 *)&dc[-0x1037].vt;
      uVar11 = *(undefined4 *)((long)&dc[-0x1037].vt + 4);
      *(undefined4 *)&dc[-0x1036].vt = *(undefined4 *)&dc[-0x1038].vt;
      *(undefined4 *)((long)&dc[-0x1036].vt + 4) = uVar9;
      *(undefined4 *)&dc[-0x1035].vt = uVar10;
      *(undefined4 *)((long)&dc[-0x1035].vt + 4) = uVar11;
      *(undefined4 *)&dc[-0x1033].vt = 6;
      break;
    case 2:
      *(undefined4 *)&dc[-0x1033].vt = 2;
    }
    goto switchD_0012a47d_default;
  case 2:
    if (iVar12 < 0xe) goto LAB_0012ac39;
    psVar14 = dc[-0x1003].vt;
    *(uint *)&dc[-0x1032].vt = ((uint)psVar14 & 0x1f) + 0x101;
    *(uint *)((long)&dc[-0x1032].vt + 4) = ((uint)((ulong)psVar14 >> 5) & 0x1f) + 1;
    *(uint *)&dc[-0x1031].vt = ((uint)((ulong)psVar14 >> 10) & 0xf) + 4;
    *(int *)&dc[-0x1002].vt = iVar12 + -0xe;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar14 >> 0xe);
    *(undefined4 *)((long)&dc[-0x1031].vt + 4) = 0;
    *(undefined4 *)&dc[-0x1033].vt = 3;
    *(undefined4 *)((long)&dc[-0x102c].vt + 3) = 0;
    lengths[0] = '\0';
    lengths[1] = '\0';
    lengths[2] = '\0';
    lengths[3] = '\0';
    lengths[4] = '\0';
    lengths[5] = '\0';
    lengths[6] = '\0';
    lengths[7] = '\0';
    *(undefined8 *)((long)&dc[-0x102d].vt + 4) = 0;
    goto switchD_0012a47d_default;
  case 3:
    if (iVar12 < 3) goto LAB_0012ac39;
    iVar17 = *(int *)&dc[-0x1031].vt;
    uVar13 = *(uint *)((long)&dc[-0x1031].vt + 4);
    uVar19 = (ulong)uVar13;
    if ((int)uVar13 < iVar17) {
      uVar19 = (ulong)(int)uVar13;
      do {
        if (iVar12 < 3) goto LAB_0012aa4e;
        psVar14 = dc[-0x1003].vt;
        *(int *)((long)&dc[-0x1031].vt + 4) = (int)uVar19 + 1;
        pbVar2 = "\x10\x11\x12" + uVar19;
        uVar19 = uVar19 + 1;
        *(byte *)((long)dc + ((ulong)*pbVar2 - 0x816c)) = (byte)psVar14 & 7;
        iVar12 = iVar12 + -3;
        *(int *)&dc[-0x1002].vt = iVar12;
        dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar14 >> 3);
      } while ((long)iVar17 != uVar19);
    }
    else {
LAB_0012aa4e:
      if ((int)uVar19 != iVar17) goto switchD_0012a47d_default;
    }
    psVar14 = (ssh_compression_alg *)zlib_mktable(lengths,0x13);
    dc[-0x1034].vt = psVar14;
    *(undefined4 *)&dc[-0x1033].vt = 4;
    *(undefined4 *)((long)&dc[-0x1031].vt + 4) = 0;
    goto switchD_0012a47d_default;
  case 4:
    if (*(int *)((long)&dc[-0x1031].vt + 4) <
        *(int *)((long)&dc[-0x1032].vt + 4) + *(int *)&dc[-0x1032].vt) {
      iVar12 = zlib_huflookup((unsigned_long *)bitsp,(int *)nbitsp,(zlib_table *)dc[-0x1034].vt);
      if (iVar12 == -2) goto LAB_0012ac60;
      if (iVar12 == -1) goto LAB_0012ac39;
      if (iVar12 < 0x10) {
        iVar17 = *(int *)((long)&dc[-0x1031].vt + 4);
        *(int *)((long)&dc[-0x1031].vt + 4) = iVar17 + 1;
        *(char *)((long)dc + (long)iVar17 + -0x8159) = (char)iVar12;
      }
      else {
        uVar13 = 0;
        iVar17 = (uint)(iVar12 != 0x11) * 4 + 3;
        if (iVar12 == 0x10) {
          iVar17 = 2;
        }
        *(int *)&dc[-0x1030].vt = iVar17;
        *(uint *)((long)&dc[-0x1030].vt + 4) = (uint)(iVar12 == 0x12) * 8 + 3;
        if ((iVar12 == 0x10) && (iVar12 = *(int *)((long)&dc[-0x1031].vt + 4), 0 < iVar12)) {
          uVar13 = (uint)puVar15[iVar12 - 1];
        }
        *(uint *)((long)&dc[-0x102f].vt + 4) = uVar13;
        *(undefined4 *)&dc[-0x1033].vt = 5;
      }
    }
    else {
      psVar14 = (ssh_compression_alg *)zlib_mktable(puVar15,*(int *)&dc[-0x1032].vt);
      dc[-0x1036].vt = psVar14;
      psVar14 = (ssh_compression_alg *)
                zlib_mktable(puVar15 + *(int *)&dc[-0x1032].vt,*(int *)((long)&dc[-0x1032].vt + 4));
      dc[-0x1035].vt = psVar14;
      zlib_freetable((zlib_table **)(dc + -0x1034));
      dc[-0x1034].vt = (ssh_compression_alg *)0x0;
      *(undefined4 *)&dc[-0x1033].vt = 6;
    }
    goto switchD_0012a47d_default;
  case 5:
    iVar17 = *(int *)&dc[-0x1030].vt;
    if (iVar12 < iVar17) goto LAB_0012ac39;
    iVar6 = *(int *)((long)&dc[-0x1030].vt + 4);
    uVar13 = ~(-1 << ((byte)iVar17 & 0x1f)) & (uint)dc[-0x1003].vt;
    *(int *)&dc[-0x1002].vt = iVar12 - iVar17;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> ((byte)iVar17 & 0x3f));
    if (0 < (int)(uVar13 + iVar6)) {
      iVar12 = *(int *)((long)&dc[-0x1031].vt + 4);
      iVar17 = iVar6 + uVar13 + 1;
      do {
        if (*(int *)((long)&dc[-0x1032].vt + 4) + *(int *)&dc[-0x1032].vt <= iVar12) break;
        *(undefined1 *)((long)dc + (long)iVar12 + -0x8159) =
             *(undefined1 *)((long)&dc[-0x102f].vt + 4);
        iVar12 = *(int *)((long)&dc[-0x1031].vt + 4) + 1;
        *(int *)((long)&dc[-0x1031].vt + 4) = iVar12;
        iVar17 = iVar17 + -1;
      } while (1 < iVar17);
    }
    *(undefined4 *)&dc[-0x1033].vt = 4;
    goto switchD_0012a47d_default;
  case 6:
    uVar13 = zlib_huflookup((unsigned_long *)bitsp,(int *)nbitsp,(zlib_table *)ztab_00->vt);
    if (uVar13 == 0xfffffffe) goto LAB_0012ac60;
    if (uVar13 == 0xffffffff) goto LAB_0012ac39;
    if ((int)uVar13 < 0x100) {
      *(uchar *)((long)dc + (long)*(int *)((long)&dc[-2].vt + 4) + -0x800c) = (uchar)uVar13;
      *(uint *)((long)&dc[-2].vt + 4) = *(int *)((long)&dc[-2].vt + 4) + 1U & 0x7fff;
      BinarySink_put_byte((BinarySink *)&(dc[-1].vt)->compress_free,(uchar)uVar13);
      goto switchD_0012a47d_default;
    }
    if (uVar13 == 0x100) {
      *(undefined4 *)&dc[-0x1033].vt = 1;
      if (dc[-0x1036].vt != dc[-0x1038].vt) {
        zlib_freetable((zlib_table **)ztab_00);
        ztab_00->vt = (ssh_compression_alg *)0x0;
      }
      if (dc[-0x1035].vt != dc[-0x1037].vt) {
        zlib_freetable((zlib_table **)ztab);
        ztab->vt = (ssh_compression_alg *)0x0;
      }
      goto switchD_0012a47d_default;
    }
    if (uVar13 < 0x11e) {
      *(undefined4 *)&dc[-0x1033].vt = 7;
      *(uint *)((long)&dc[-0x1033].vt + 4) = uVar13;
      goto switchD_0012a47d_default;
    }
    goto LAB_0012ac60;
  case 7:
    lVar18 = (long)*(int *)((long)&dc[-0x1033].vt + 4);
    sVar5 = *(short *)("void ssh2_transport_reconfigure(PacketProtocolLayer *, Conf *)" +
                      lVar18 * 0xc + 0xf);
    if (iVar12 < sVar5) goto LAB_0012ac39;
    *(uint *)&dc[-0x102f].vt =
         (~(-1 << ((byte)sVar5 & 0x1f)) & (uint)dc[-0x1003].vt) +
         *(int *)("void ssh2_transport_reconfigure(PacketProtocolLayer *, Conf *)" +
                 lVar18 * 0xc + 0x11);
    *(int *)&dc[-0x1002].vt = iVar12 - sVar5;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> ((byte)sVar5 & 0x3f));
    *(undefined4 *)&dc[-0x1033].vt = 8;
    goto switchD_0012a47d_default;
  case 8:
    iVar12 = zlib_huflookup((unsigned_long *)bitsp,(int *)nbitsp,(zlib_table *)ztab->vt);
    if (iVar12 == -1) goto LAB_0012ac39;
    if ((iVar12 != -2) && (iVar12 < 0x1e)) {
      *(undefined4 *)&dc[-0x1033].vt = 9;
      *(int *)((long)&dc[-0x1033].vt + 4) = iVar12;
      goto switchD_0012a47d_default;
    }
LAB_0012ac60:
    *outblock = (uchar *)0x0;
    *outlen = 0;
    return false;
  case 9:
    iVar17 = *(int *)((long)&dc[-0x1033].vt + 4);
    sVar5 = distcodes[iVar17].extrabits;
    if (iVar12 < sVar5) goto LAB_0012ac39;
    iVar17 = distcodes[iVar17].min;
    psVar14 = dc[-0x1003].vt;
    *(int *)&dc[-0x1002].vt = iVar12 - sVar5;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar14 >> ((byte)sVar5 & 0x3f));
    *(undefined4 *)&dc[-0x1033].vt = 6;
    psVar1 = dc + -0x102f;
    iVar12 = *(int *)&psVar1->vt;
    *(int *)&psVar1->vt = *(int *)&psVar1->vt + -1;
    if (iVar12 != 0) {
      do {
        iVar12 = *(int *)((long)&dc[-2].vt + 4);
        uVar4 = *(uchar *)((long)dc +
                          ((ulong)(iVar12 - ((~(-1 << ((byte)sVar5 & 0x1f)) & (uint)psVar14) +
                                            iVar17) & 0x7fff) - 0x800c));
        *(uchar *)((long)dc + (long)iVar12 + -0x800c) = uVar4;
        *(uint *)((long)&dc[-2].vt + 4) = *(int *)((long)&dc[-2].vt + 4) + 1U & 0x7fff;
        BinarySink_put_byte((BinarySink *)&(dc[-1].vt)->compress_free,uVar4);
        psVar1 = dc + -0x102f;
        iVar12 = *(int *)&psVar1->vt;
        *(int *)&psVar1->vt = *(int *)&psVar1->vt + -1;
      } while (iVar12 != 0);
    }
    goto switchD_0012a47d_default;
  case 10:
    if (iVar12 < 0x10) goto LAB_0012ac39;
    *(uint *)&dc[-0x102e].vt = (uint)dc[-0x1003].vt & 0xffff;
    *(int *)&dc[-0x1002].vt = iVar12 + -0x10;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 0x10);
    *(undefined4 *)&dc[-0x1033].vt = 0xb;
    goto switchD_0012a47d_default;
  case 0xb:
    if (iVar12 < 0x10) goto LAB_0012ac39;
    psVar14 = dc[-0x1003].vt;
    *(int *)&dc[-0x1002].vt = iVar12 + -0x10;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar14 >> 0x10);
    if (((uint)psVar14 & 0xffff ^ *(uint *)&dc[-0x102e].vt) != 0xffff) goto LAB_0012ac60;
    if (*(uint *)&dc[-0x102e].vt != 0) {
      *(undefined4 *)&dc[-0x1033].vt = 0xc;
      goto switchD_0012a47d_default;
    }
    break;
  case 0xc:
    if (iVar12 < 8) goto LAB_0012ac39;
    uVar4 = *(uchar *)&dc[-0x1003].vt;
    *(uchar *)((long)dc + (long)*(int *)((long)&dc[-2].vt + 4) + -0x800c) = uVar4;
    *(uint *)((long)&dc[-2].vt + 4) = *(int *)((long)&dc[-2].vt + 4) + 1U & 0x7fff;
    BinarySink_put_byte((BinarySink *)&(dc[-1].vt)->compress_free,uVar4);
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -8;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 8);
    psVar1 = dc + -0x102e;
    *(int *)&psVar1->vt = *(int *)&psVar1->vt + -1;
    if (*(int *)&psVar1->vt != 0) goto switchD_0012a47d_default;
    break;
  default:
    goto switchD_0012a47d_default;
  }
  *(undefined4 *)&dc[-0x1033].vt = 1;
  goto switchD_0012a47d_default;
}

Assistant:

bool zlib_decompress_block(ssh_decompressor *dc,
                           const unsigned char *block, int len,
                           unsigned char **outblock, int *outlen)
{
    struct zlib_decompress_ctx *dctx =
        container_of(dc, struct zlib_decompress_ctx, dc);
    const coderecord *rec;
    int code, blktype, rep, dist, nlen, header;
    static const unsigned char lenlenmap[] = {
        16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
    };

    assert(!dctx->outblk);
    dctx->outblk = strbuf_new_nm();

    while (len > 0 || dctx->nbits > 0) {
        while (dctx->nbits < 24 && len > 0) {
            dctx->bits |= (*block++) << dctx->nbits;
            dctx->nbits += 8;
            len--;
        }
        switch (dctx->state) {
          case START:
            /* Expect 16-bit zlib header. */
            if (dctx->nbits < 16)
                goto finished;         /* done all we can */

            /*
             * The header is stored as a big-endian 16-bit integer,
             * in contrast to the general little-endian policy in
             * the rest of the format :-(
             */
            header = (((dctx->bits & 0xFF00) >> 8) |
                      ((dctx->bits & 0x00FF) << 8));
            EATBITS(16);

            /*
             * Check the header:
             *
             *  - bits 8-11 should be 1000 (Deflate/RFC1951)
             *  - bits 12-15 should be at most 0111 (window size)
             *  - bit 5 should be zero (no dictionary present)
             *  - we don't care about bits 6-7 (compression rate)
             *  - bits 0-4 should be set up to make the whole thing
             *    a multiple of 31 (checksum).
             */
            if ((header & 0x0F00) != 0x0800 ||
                (header & 0xF000) >  0x7000 ||
                (header & 0x0020) != 0x0000 ||
                (header % 31) != 0)
                goto decode_error;

            dctx->state = OUTSIDEBLK;
            break;
          case OUTSIDEBLK:
            /* Expect 3-bit block header. */
            if (dctx->nbits < 3)
                goto finished;         /* done all we can */
            EATBITS(1);
            blktype = dctx->bits & 3;
            EATBITS(2);
            if (blktype == 0) {
                int to_eat = dctx->nbits & 7;
                dctx->state = UNCOMP_LEN;
                EATBITS(to_eat);       /* align to byte boundary */
            } else if (blktype == 1) {
                dctx->currlentable = dctx->staticlentable;
                dctx->currdisttable = dctx->staticdisttable;
                dctx->state = INBLK;
            } else if (blktype == 2) {
                dctx->state = TREES_HDR;
            }
            break;
          case TREES_HDR:
            /*
             * Dynamic block header. Five bits of HLIT, five of
             * HDIST, four of HCLEN.
             */
            if (dctx->nbits < 5 + 5 + 4)
                goto finished;         /* done all we can */
            dctx->hlit = 257 + (dctx->bits & 31);
            EATBITS(5);
            dctx->hdist = 1 + (dctx->bits & 31);
            EATBITS(5);
            dctx->hclen = 4 + (dctx->bits & 15);
            EATBITS(4);
            dctx->lenptr = 0;
            dctx->state = TREES_LENLEN;
            memset(dctx->lenlen, 0, sizeof(dctx->lenlen));
            break;
          case TREES_LENLEN:
            if (dctx->nbits < 3)
                goto finished;
            while (dctx->lenptr < dctx->hclen && dctx->nbits >= 3) {
                dctx->lenlen[lenlenmap[dctx->lenptr++]] =
                    (unsigned char) (dctx->bits & 7);
                EATBITS(3);
            }
            if (dctx->lenptr == dctx->hclen) {
                dctx->lenlentable = zlib_mktable(dctx->lenlen, 19);
                dctx->state = TREES_LEN;
                dctx->lenptr = 0;
            }
            break;
          case TREES_LEN:
            if (dctx->lenptr >= dctx->hlit + dctx->hdist) {
                dctx->currlentable = zlib_mktable(dctx->lengths, dctx->hlit);
                dctx->currdisttable = zlib_mktable(dctx->lengths + dctx->hlit,
                                                  dctx->hdist);
                zlib_freetable(&dctx->lenlentable);
                dctx->lenlentable = NULL;
                dctx->state = INBLK;
                break;
            }
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits, dctx->lenlentable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code < 16)
                dctx->lengths[dctx->lenptr++] = code;
            else {
                dctx->lenextrabits = (code == 16 ? 2 : code == 17 ? 3 : 7);
                dctx->lenaddon = (code == 18 ? 11 : 3);
                dctx->lenrep = (code == 16 && dctx->lenptr > 0 ?
                               dctx->lengths[dctx->lenptr - 1] : 0);
                dctx->state = TREES_LENREP;
            }
            break;
          case TREES_LENREP:
            if (dctx->nbits < dctx->lenextrabits)
                goto finished;
            rep =
                dctx->lenaddon +
                (dctx->bits & ((1 << dctx->lenextrabits) - 1));
            EATBITS(dctx->lenextrabits);
            while (rep > 0 && dctx->lenptr < dctx->hlit + dctx->hdist) {
                dctx->lengths[dctx->lenptr] = dctx->lenrep;
                dctx->lenptr++;
                rep--;
            }
            dctx->state = TREES_LEN;
            break;
          case INBLK:
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits, dctx->currlentable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code < 256)
                zlib_emit_char(dctx, code);
            else if (code == 256) {
                dctx->state = OUTSIDEBLK;
                if (dctx->currlentable != dctx->staticlentable) {
                    zlib_freetable(&dctx->currlentable);
                    dctx->currlentable = NULL;
                }
                if (dctx->currdisttable != dctx->staticdisttable) {
                    zlib_freetable(&dctx->currdisttable);
                    dctx->currdisttable = NULL;
                }
            } else if (code < 286) {
                dctx->state = GOTLENSYM;
                dctx->sym = code;
            } else {
                /* literal/length symbols 286 and 287 are invalid */
                goto decode_error;
            }
            break;
          case GOTLENSYM:
            rec = &lencodes[dctx->sym - 257];
            if (dctx->nbits < rec->extrabits)
                goto finished;
            dctx->len =
                rec->min + (dctx->bits & ((1 << rec->extrabits) - 1));
            EATBITS(rec->extrabits);
            dctx->state = GOTLEN;
            break;
          case GOTLEN:
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits,
                               dctx->currdisttable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code >= 30)            /* dist symbols 30 and 31 are invalid */
                goto decode_error;
            dctx->state = GOTDISTSYM;
            dctx->sym = code;
            break;
          case GOTDISTSYM:
            rec = &distcodes[dctx->sym];
            if (dctx->nbits < rec->extrabits)
                goto finished;
            dist = rec->min + (dctx->bits & ((1 << rec->extrabits) - 1));
            EATBITS(rec->extrabits);
            dctx->state = INBLK;
            while (dctx->len--)
                zlib_emit_char(dctx, dctx->window[(dctx->winpos - dist) &
                                                  (WINSIZE - 1)]);
            break;
          case UNCOMP_LEN:
            /*
             * Uncompressed block. We expect to see a 16-bit LEN.
             */
            if (dctx->nbits < 16)
                goto finished;
            dctx->uncomplen = dctx->bits & 0xFFFF;
            EATBITS(16);
            dctx->state = UNCOMP_NLEN;
            break;
          case UNCOMP_NLEN:
            /*
             * Uncompressed block. We expect to see a 16-bit NLEN,
             * which should be the one's complement of the previous
             * LEN.
             */
            if (dctx->nbits < 16)
                goto finished;
            nlen = dctx->bits & 0xFFFF;
            EATBITS(16);
            if (dctx->uncomplen != (nlen ^ 0xFFFF))
                goto decode_error;
            if (dctx->uncomplen == 0)
                dctx->state = OUTSIDEBLK;       /* block is empty */
            else
                dctx->state = UNCOMP_DATA;
            break;
          case UNCOMP_DATA:
            if (dctx->nbits < 8)
                goto finished;
            zlib_emit_char(dctx, dctx->bits & 0xFF);
            EATBITS(8);
            if (--dctx->uncomplen == 0)
                dctx->state = OUTSIDEBLK;       /* end of uncompressed block */
            break;
        }
    }

  finished:
    *outlen = dctx->outblk->len;
    *outblock = (unsigned char *)strbuf_to_str(dctx->outblk);
    dctx->outblk = NULL;
    return true;

  decode_error:
    *outblock = NULL;
    *outlen = 0;
    return false;
}